

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<QVariant>::remove(QList<QVariant> *this,char *__filename)

{
  QList<QVariant> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QVariant *in_stack_00000018;
  QMovableArrayOps<QVariant> *in_stack_00000020;
  QArrayDataPointer<QVariant> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QVariant>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QVariant>::operator->(&this->d);
    QArrayDataPointer<QVariant>::operator->(&this->d);
    QArrayDataPointer<QVariant>::begin((QArrayDataPointer<QVariant> *)0x3c53b9);
    QtPrivate::QMovableArrayOps<QVariant>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}